

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mk_rconf.c
# Opt level: O0

char * mk_rconf_meta_get(mk_rconf *conf,char *key)

{
  int iVar1;
  mk_list *__mptr;
  mk_rconf_entry *meta;
  mk_list *head;
  char *key_local;
  mk_rconf *conf_local;
  
  meta = (mk_rconf_entry *)(conf->metas).next;
  while( true ) {
    if (meta == (mk_rconf_entry *)&conf->metas) {
      return (char *)0x0;
    }
    iVar1 = strcmp((char *)meta[-1]._head.prev,key);
    if (iVar1 == 0) break;
    meta = (mk_rconf_entry *)meta->val;
  }
  return (char *)meta[-1]._head.next;
}

Assistant:

char *mk_rconf_meta_get(struct mk_rconf *conf, char *key)
{
    struct mk_list *head;
    struct mk_rconf_entry *meta;

    mk_list_foreach(head, &conf->metas) {
        meta = mk_list_entry(head, struct mk_rconf_entry, _head);
        if (strcmp(meta->key, key) == 0) {
            return meta->val;
        }
    }

    return NULL;
}